

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O1

_Bool verify_level(chunk_conflict *c)

{
  loc grid;
  _Bool _Var1;
  square *psVar2;
  monster *pmVar3;
  object *poVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint local_68;
  uint local_64;
  ulong local_60;
  loc_conflict local_58;
  ulong local_50;
  loc_conflict local_48;
  ulong local_40;
  loc_conflict local_38;
  
  local_38 = loc(0,0);
  local_40 = (ulong)local_38 >> 0x20;
  local_48 = loc(0,0);
  local_50 = (ulong)local_48 >> 0x20;
  local_58 = loc(0,0);
  local_60 = (ulong)local_58 >> 0x20;
  if (c->height < 1) {
    uVar6 = 0;
    local_68 = 0;
    local_64 = 0;
  }
  else {
    lVar10 = 0;
    uVar9 = 0;
    local_64 = 0;
    local_68 = 0;
    uVar6 = 0;
    do {
      uVar5 = (ulong)(uint)c->width;
      if (0 < c->width) {
        uVar8 = 0;
        do {
          if ((((uVar8 == 0 || uVar9 == 0) || (uVar9 == c->height - 1)) || (uVar8 == (int)uVar5 - 1)
              ) && (psVar2 = square(c,(loc)(lVar10 + uVar8)), FEAT_PERM != (uint)psVar2->feat)) {
            uVar6 = uVar6 + 1;
            local_40 = uVar9 & 0xffffffff;
            local_38 = (loc_conflict)(uVar8 & 0xffffffff);
          }
          grid = (loc)(lVar10 + uVar8);
          pmVar3 = square_monster(c,grid);
          if ((pmVar3 != (monster *)0x0) && (_Var1 = square_is_monster_walkable(c,grid), !_Var1)) {
            local_68 = local_68 + 1;
            local_50 = uVar9 & 0xffffffff;
            local_48 = (loc_conflict)(uVar8 & 0xffffffff);
          }
          poVar4 = square_object(c,grid);
          if ((poVar4 != (object *)0x0) && (_Var1 = square_isobjectholding(c,grid), !_Var1)) {
            local_64 = local_64 + 1;
            local_60 = uVar9 & 0xffffffff;
            local_58 = (loc_conflict)(uVar8 & 0xffffffff);
          }
          uVar8 = uVar8 + 1;
          uVar5 = (ulong)c->width;
        } while ((long)uVar8 < (long)uVar5);
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x100000000;
    } while ((long)uVar9 < (long)c->height);
  }
  uVar9 = (ulong)uVar6;
  if ((uVar6 != 0 || local_68 != 0) || local_64 != 0) {
    if (uVar6 == 0) {
      if (local_68 == 0) {
        psVar2 = square(c,(loc)((ulong)local_58 & 0xffffffff | local_60 << 0x20));
        uVar5 = (ulong)psVar2->feat;
        pcVar7 = "Broken Object:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d";
        uVar9 = (ulong)local_64;
        local_38 = local_58;
        local_40 = local_60;
      }
      else {
        psVar2 = square(c,(loc)((ulong)local_48 & 0xffffffff | local_50 << 0x20));
        uVar5 = (ulong)psVar2->feat;
        pcVar7 = "Broken Monster:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d";
        uVar9 = (ulong)local_68;
        local_38 = local_48;
        local_40 = local_50;
      }
    }
    else {
      psVar2 = square(c,(loc)((ulong)local_38 & 0xffffffff | local_40 << 0x20));
      uVar5 = (ulong)psVar2->feat;
      pcVar7 = "Broken Wilderness:  %d Bounding Walls; Last at (x=%d,y=%d) with Feature=%d";
    }
    pcVar7 = format(pcVar7,uVar9,(ulong)local_38 & 0xffffffff,local_40,uVar5);
    dump_level_simple((char *)0x0,pcVar7,c);
    msg("Restarting wilderness generation; bad level in dumpedlevel.html");
  }
  return (uVar6 == 0 && local_68 == 0) && local_64 == 0;
}

Assistant:

static bool verify_level(struct chunk *c)
{
	struct loc last_bad_bnd = loc(0, 0);
	struct loc last_bad_mon = loc(0, 0);
	struct loc last_bad_obj = loc(0, 0);
	int broken_bnd = 0, broken_mon = 0, broken_obj = 0;
	struct loc grid;

	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			if ((grid.y == 0 || grid.x == 0
					|| grid.y == c->height - 1
					|| grid.x == c->width - 1)
					&& square(c, grid)->feat != FEAT_PERM) {
				++broken_bnd;
				last_bad_bnd = grid;
			}
			if (square_monster(c, grid)
					&& !square_is_monster_walkable(c, grid)) {
				++broken_mon;
				last_bad_mon = grid;
			}
			if (square_object(c, grid)
					&& !square_isobjectholding(c, grid)) {
				++broken_obj;
				last_bad_obj = grid;
			}
		}
	}

	if (broken_bnd || broken_mon || broken_obj) {
		const char *title;

		if (broken_bnd) {
			title = format("Broken Wilderness:  %d Bounding Walls; Last at (x=%d,y=%d) with Feature=%d",
				broken_bnd, last_bad_bnd.x, last_bad_bnd.y,
				(int) square(c, last_bad_bnd)->feat);
		} else if (broken_mon) {
			title = format("Broken Monster:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d",
				broken_mon, last_bad_mon.x, last_bad_mon.y,
				(int) square(c, last_bad_mon)->feat);
		} else {
			title = format("Broken Object:  %d Embedded in Terrain; Last at (x=%d,y=%d) with Terrain=%d",
				broken_obj, last_bad_obj.x, last_bad_obj.y,
				(int) square(c, last_bad_obj)->feat);
		}
		dump_level_simple(NULL, title, c);
		msg("Restarting wilderness generation; bad level in dumpedlevel.html");
		return false;
	}
	return true;
}